

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters_dense.h
# Opt level: O0

void __thiscall
dense_parameters::set_default<initial_weights,set_initial_lda_wrapper<dense_parameters>>
          (dense_parameters *this,initial_weights *info)

{
  bool bVar1;
  int __c;
  dense_iterator<float> *rhs;
  dense_parameters *in_RDI;
  size_t i;
  iterator iter;
  initial_weights *in_stack_ffffffffffffffb8;
  weight *in_stack_ffffffffffffffc0;
  dense_iterator<float> local_28;
  
  begin(in_RDI);
  while( true ) {
    end(in_RDI);
    rhs = (dense_iterator<float> *)&stack0xffffffffffffffb8;
    bVar1 = dense_iterator<float>::operator!=(&local_28,rhs);
    if (!bVar1) break;
    dense_iterator<float>::operator*(&local_28);
    dense_iterator<float>::index(&local_28,(char *)rhs,__c);
    set_initial_lda_wrapper<dense_parameters>::func
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(uint64_t)in_RDI);
    dense_iterator<float>::operator++(&local_28);
    stride(in_RDI);
  }
  return;
}

Assistant:

void set_default(R& info)
  {
    iterator iter = begin();
    for (size_t i = 0; iter != end(); ++iter, i += stride()) T::func(*iter, info, iter.index());
  }